

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSettingsHandler_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *param_3,char *line)

{
  ImVector<ImGuiDockNodeSettings> *this;
  ImGuiID IVar1;
  undefined1 uVar2;
  int iVar3;
  char *pcVar4;
  ImVec2ih *pIVar5;
  ImGuiDockNodeSettings *pIVar6;
  int n;
  int r;
  int x;
  char c;
  int y;
  ImGuiDockNodeSettings local_48;
  
  x = 0;
  y = 0;
  r = 0;
  c = '\0';
  local_48.Pos.x = 0;
  local_48.Pos.y = 0;
  local_48.Size.x = 0;
  local_48.Size.y = 0;
  local_48.ID = 0;
  local_48.ParentNodeId = 0;
  local_48.ParentWindowId = 0;
  local_48.SelectedTabId = 0;
  local_48.SizeRef.x = 0;
  local_48.SizeRef.y = 0;
  local_48.SplitAxis = -1;
  local_48.Depth = '\0';
  local_48._18_2_ = 0;
  local_48.Flags = 0;
  pcVar4 = ImStrSkipBlank(line);
  iVar3 = strncmp(pcVar4,"DockNode",8);
  if (iVar3 == 0) {
    pcVar4 = ImStrSkipBlank(pcVar4 + 8);
  }
  else {
    iVar3 = strncmp(pcVar4,"DockSpace",9);
    if (iVar3 != 0) {
      return;
    }
    pcVar4 = ImStrSkipBlank(pcVar4 + 9);
    local_48.Flags = 0x400;
  }
  iVar3 = __isoc99_sscanf(pcVar4,"ID=0x%08X%n",&local_48,&r);
  if (iVar3 != 1) {
    return;
  }
  pcVar4 = pcVar4 + r;
  iVar3 = __isoc99_sscanf(pcVar4," Parent=0x%08X%n",&local_48.ParentNodeId);
  if (iVar3 == 1) {
    if (local_48.ParentNodeId == 0) {
      return;
    }
    pcVar4 = pcVar4 + r;
  }
  iVar3 = __isoc99_sscanf(pcVar4," Window=0x%08X%n",&local_48.ParentWindowId,&r);
  if (iVar3 == 1) {
    if (local_48.ParentWindowId == 0) {
      return;
    }
    pcVar4 = pcVar4 + r;
  }
  if (local_48.ParentNodeId == 0) {
    iVar3 = __isoc99_sscanf(pcVar4," Pos=%i,%i%n",&x,&y,&r);
    if (iVar3 != 2) {
      return;
    }
    pcVar4 = pcVar4 + r;
    local_48.Pos = (ImVec2ih)(y << 0x10 | x & 0xffffU);
    iVar3 = __isoc99_sscanf(pcVar4," Size=%i,%i%n");
    if (iVar3 != 2) {
      return;
    }
    pIVar5 = &local_48.Size;
LAB_0013c5c0:
    pcVar4 = pcVar4 + r;
    *pIVar5 = (ImVec2ih)(y << 0x10 | x & 0xffffU);
  }
  else {
    iVar3 = __isoc99_sscanf(pcVar4," SizeRef=%i,%i%n",&x,&y,&r);
    if (iVar3 == 2) {
      pIVar5 = &local_48.SizeRef;
      goto LAB_0013c5c0;
    }
  }
  iVar3 = __isoc99_sscanf(pcVar4," Split=%c%n",&c,&r);
  if (iVar3 == 1) {
    pcVar4 = pcVar4 + r;
    if (c == 'X') {
      uVar2 = 0;
    }
    else {
      if (c != 'Y') goto LAB_0013c615;
      uVar2 = 1;
    }
    local_48.SplitAxis = uVar2;
  }
LAB_0013c615:
  iVar3 = __isoc99_sscanf(pcVar4," NoResize=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x2000000000;
  }
  iVar3 = __isoc99_sscanf(pcVar4," CentralNode=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x80000000000;
  }
  iVar3 = __isoc99_sscanf(pcVar4," NoTabBar=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x100000000000;
  }
  iVar3 = __isoc99_sscanf(pcVar4," HiddenTabBar=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x200000000000;
  }
  iVar3 = __isoc99_sscanf(pcVar4," NoWindowMenuButton=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x400000000000;
  }
  iVar3 = __isoc99_sscanf(pcVar4," NoCloseButton=%d%n",&x,&r);
  if ((iVar3 == 1) && (pcVar4 = pcVar4 + r, x != 0)) {
    local_48._16_8_ = local_48._16_8_ | 0x800000000000;
  }
  iVar3 = 0;
  __isoc99_sscanf(pcVar4," Selected=0x%08X%n",&local_48.SelectedTabId,&r);
  IVar1 = local_48.ParentNodeId;
  if (local_48.ParentNodeId != 0) {
    this = &(ctx->DockContext).NodesSettings;
    for (; iVar3 < this->Size; iVar3 = iVar3 + 1) {
      pIVar6 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar3);
      if (pIVar6->ID == IVar1) {
        pIVar6 = ImVector<ImGuiDockNodeSettings>::operator[](this,iVar3);
        local_48.Depth = pIVar6->Depth + '\x01';
        break;
      }
    }
  }
  ImVector<ImGuiDockNodeSettings>::push_back(&(ctx->DockContext).NodesSettings,&local_48);
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void*, const char* line)
{
    char c = 0;
    int x = 0, y = 0;
    int r = 0;

    // Parsing, e.g.
    // " DockNode   ID=0x00000001 Pos=383,193 Size=201,322 Split=Y,0.506 "
    // "   DockNode ID=0x00000002 Parent=0x00000001 "
    // Important: this code expect currently fields in a fixed order.
    ImGuiDockNodeSettings node;
    line = ImStrSkipBlank(line);
    if      (strncmp(line, "DockNode", 8) == 0)  { line = ImStrSkipBlank(line + strlen("DockNode")); }
    else if (strncmp(line, "DockSpace", 9) == 0) { line = ImStrSkipBlank(line + strlen("DockSpace")); node.Flags |= ImGuiDockNodeFlags_DockSpace; }
    else return;
    if (sscanf(line, "ID=0x%08X%n",      &node.ID, &r) == 1)            { line += r; } else return;
    if (sscanf(line, " Parent=0x%08X%n", &node.ParentNodeId, &r) == 1)  { line += r; if (node.ParentNodeId == 0) return; }
    if (sscanf(line, " Window=0x%08X%n", &node.ParentWindowId, &r) ==1) { line += r; if (node.ParentWindowId == 0) return; }
    if (node.ParentNodeId == 0)
    {
        if (sscanf(line, " Pos=%i,%i%n",  &x, &y, &r) == 2)         { line += r; node.Pos = ImVec2ih((short)x, (short)y); } else return;
        if (sscanf(line, " Size=%i,%i%n", &x, &y, &r) == 2)         { line += r; node.Size = ImVec2ih((short)x, (short)y); } else return;
    }
    else
    {
        if (sscanf(line, " SizeRef=%i,%i%n", &x, &y, &r) == 2)      { line += r; node.SizeRef = ImVec2ih((short)x, (short)y); }
    }
    if (sscanf(line, " Split=%c%n", &c, &r) == 1)                   { line += r; if (c == 'X') node.SplitAxis = ImGuiAxis_X; else if (c == 'Y') node.SplitAxis = ImGuiAxis_Y; }
    if (sscanf(line, " NoResize=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoResize; }
    if (sscanf(line, " CentralNode=%d%n", &x, &r) == 1)             { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_CentralNode; }
    if (sscanf(line, " NoTabBar=%d%n", &x, &r) == 1)                { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoTabBar; }
    if (sscanf(line, " HiddenTabBar=%d%n", &x, &r) == 1)            { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_HiddenTabBar; }
    if (sscanf(line, " NoWindowMenuButton=%d%n", &x, &r) == 1)      { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoWindowMenuButton; }
    if (sscanf(line, " NoCloseButton=%d%n", &x, &r) == 1)           { line += r; if (x != 0) node.Flags |= ImGuiDockNodeFlags_NoCloseButton; }
    if (sscanf(line, " Selected=0x%08X%n", &node.SelectedTabId,&r) == 1) { line += r; }
    if (node.ParentNodeId != 0)
        if (ImGuiDockNodeSettings* parent_settings = DockSettingsFindNodeSettings(ctx, node.ParentNodeId))
            node.Depth = parent_settings->Depth + 1;
    ctx->DockContext.NodesSettings.push_back(node);
}